

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_SetPropertyFunctionList(JSContext *ctx,JSValue obj,JSCFunctionListEntry *tab,int len)

{
  JSAtom v;
  JSContext *ctx_00;
  char *in_RCX;
  JSContext *in_RDI;
  int in_R8D;
  JSAtom atom;
  JSCFunctionListEntry *e;
  int i;
  JSCFunctionListEntry *in_stack_00000120;
  JSAtom in_stack_0000012c;
  JSContext *in_stack_00000130;
  undefined1 in_stack_00000138 [16];
  int local_28;
  
  for (local_28 = 0; local_28 < in_R8D; local_28 = local_28 + 1) {
    ctx_00 = (JSContext *)(in_RCX + (long)local_28 * 0x20);
    v = find_atom(in_RDI,in_RCX);
    JS_InstantiateFunctionListItem
              (in_stack_00000130,(JSValue)in_stack_00000138,in_stack_0000012c,in_stack_00000120);
    JS_FreeAtom(ctx_00,v);
  }
  return;
}

Assistant:

void JS_SetPropertyFunctionList(JSContext *ctx, JSValueConst obj,
                                const JSCFunctionListEntry *tab, int len)
{
    int i;

    for (i = 0; i < len; i++) {
        const JSCFunctionListEntry *e = &tab[i];
        JSAtom atom = find_atom(ctx, e->name);
        JS_InstantiateFunctionListItem(ctx, obj, atom, e);
        JS_FreeAtom(ctx, atom);
    }
}